

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.hpp
# Opt level: O1

void __thiscall csv::internals::MmapParser::~MmapParser(MmapParser *this)

{
  ~MmapParser(this);
  operator_delete(this,0x5c0);
  return;
}

Assistant:

~MmapParser() {}